

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O3

pcp_errno pcp_db_add_flow(pcp_flow_t *f)

{
  size_t *psVar1;
  pcp_ctx_s *ppVar2;
  pcp_flow_t *ppVar3;
  pcp_flow_t **pppVar4;
  uint uVar5;
  long lVar6;
  pcp_flow_t **pppVar7;
  
  if (f != (pcp_flow_t *)0x0) {
    ppVar2 = f->ctx;
    uVar5 = 0;
    lVar6 = 0x57;
    do {
      uVar5 = (uint)*(byte *)((long)(f->kd).nonce.n + lVar6 + -0x34) ^ (uVar5 << 8 | uVar5 >> 0x18);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0xb);
    uVar5 = uVar5 * -0x61c88647 >> 0x1b;
    f->key_bucket = uVar5;
    pppVar4 = (ppVar2->pcp_db).flows + uVar5;
    do {
      pppVar7 = pppVar4;
      ppVar3 = *pppVar7;
      pppVar4 = &ppVar3->next;
    } while (ppVar3 != (pcp_flow_t *)0x0);
    *pppVar7 = f;
    f->next = (pcp_flow_s *)0x0;
    psVar1 = &(ppVar2->pcp_db).flow_cnt;
    *psVar1 = *psVar1 + 1;
    return PCP_ERR_SUCCESS;
  }
  return PCP_ERR_BAD_ARGS;
}

Assistant:

pcp_errno pcp_db_add_flow(pcp_flow_t *f) {
    uint32_t indx;
    pcp_flow_t **fdb;
    pcp_ctx_t *ctx;

    if (!f) {
        return PCP_ERR_BAD_ARGS;
    }

    ctx = f->ctx;

    f->key_bucket = indx = compute_flow_key(&f->kd);
    PCP_LOG(PCP_LOGLVL_DEBUG, "Adding flow %p, key_bucket %d", f,
            f->key_bucket);

    for (fdb = ctx->pcp_db.flows + indx; (*fdb) != NULL; fdb = &(*fdb)->next)
        ;

    *fdb = f;
    f->next = NULL;
    ctx->pcp_db.flow_cnt++;

    PCP_LOG(PCP_LOGLVL_DEBUG, "total Number of flows added %zu",
            ctx->pcp_db.flow_cnt);

    return PCP_ERR_SUCCESS;
}